

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_node_set
          (xpath_node_set_raw *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack,nodeset_eval_t eval)

{
  char cVar1;
  byte bVar2;
  xml_attribute_struct *pxVar3;
  xml_node_struct *pxVar4;
  xpath_variable *pxVar5;
  type_t type;
  uint *puVar6;
  xpath_node_set_raw *extraout_RAX;
  xpath_node_set_raw *extraout_RAX_00;
  xpath_node_set_raw *extraout_RAX_01;
  xpath_node_set_raw *extraout_RAX_02;
  xpath_node_set_raw *pxVar7;
  bool once;
  xpath_allocator_capture cr;
  xpath_stack swapped_stack;
  xpath_node_set_raw rs;
  xpath_allocator_capture local_78;
  xpath_stack local_58;
  xpath_node_set_raw local_48;
  
  cVar1 = this->_type;
  puVar6 = &switchD_0010e9bc::switchdataD_001173b0;
  switch(cVar1) {
  case '\x0f':
    local_78._target = stack->temp;
    local_78._state._root = (local_78._target)->_root;
    local_78._state._root_size = (local_78._target)->_root_size;
    local_78._state._error = (local_78._target)->_error;
    local_58.temp = stack->result;
    local_58.result = local_78._target;
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,eval);
    eval_node_set(&local_48,this->_right,c,&local_58,eval);
    __return_storage_ptr__->_type = type_unsorted;
    xpath_node_set_raw::append(__return_storage_ptr__,local_48._begin,local_48._end,stack->result);
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
    xpath_allocator_capture::~xpath_allocator_capture(&local_78);
    return extraout_RAX;
  case '\x11':
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,(uint)(this->_test == '\x03') * 2);
    type = __return_storage_ptr__->_type;
    if (this->_test != '\x01') {
      type = xpath_sort(__return_storage_ptr__->_begin,__return_storage_ptr__->_end,type,false);
      __return_storage_ptr__->_type = type;
    }
    once = eval == nodeset_eval_any;
    if (type == type_sorted) {
      once = eval != nodeset_eval_all;
    }
    apply_predicate(this,__return_storage_ptr__,0,stack,once);
    return extraout_RAX_01;
  case '\x14':
    pxVar5 = (this->_data).variable;
    if (pxVar5->_type != (uint)(byte)this->_rettype) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2ac7,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    if (this->_rettype == 1) {
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_type = pxVar5[1]._type;
      xpath_node_set_raw::append
                (__return_storage_ptr__,(xpath_node *)pxVar5[2]._next,*(xpath_node **)(pxVar5 + 3),
                 stack->result);
      return extraout_RAX_02;
    }
  case '\x10':
  case '\x12':
  case '\x13':
  case '\x15':
  case '\x16':
  case '\x17':
switchD_0010e9bc_caseD_10:
    __assert_fail("false && \"Wrong expression for return type node set\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x2ad8,
                  "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                 );
  case '\x18':
switchD_0010e9bc_caseD_18:
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    return (xpath_node_set_raw *)puVar6;
  }
  if (cVar1 == '8') {
    bVar2 = this->_axis;
    if (0xc < (ulong)bVar2) {
      __assert_fail("false && \"Unknown axis\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2ab2,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    puVar6 = (uint *)((long)&switchD_0010ebbe::switchdataD_001173d8 +
                     (long)(int)(&switchD_0010ebbe::switchdataD_001173d8)[bVar2]);
    switch(bVar2) {
    case 0:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 1:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 2:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 3:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 4:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 5:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 6:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 7:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 9:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 10:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 0xb:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    case 0xc:
      pxVar7 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
                         (__return_storage_ptr__,this,c,stack,eval);
      return pxVar7;
    }
    goto switchD_0010e9bc_caseD_18;
  }
  if (cVar1 != '9') goto switchD_0010e9bc_caseD_10;
  if (this->_right != (xpath_ast_node *)0x0) {
    __assert_fail("!_right",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x2ab9,
                  "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                 );
  }
  __return_storage_ptr__->_eos = (xpath_node *)0x0;
  __return_storage_ptr__->_begin = (xpath_node *)0x0;
  __return_storage_ptr__->_end = (xpath_node *)0x0;
  __return_storage_ptr__->_type = type_sorted;
  pxVar3 = (c->n)._attribute._attr;
  pxVar4 = (c->n)._node._root;
  if (pxVar4 == (xml_node_struct *)0x0 || pxVar3 != (xml_attribute_struct *)0x0) {
    if (pxVar3 == (xml_attribute_struct *)0x0) {
      return (xpath_node_set_raw *)pxVar4;
    }
    if (pxVar4 == (xml_node_struct *)0x0) {
      local_78._target = (xpath_allocator *)0x0;
      goto LAB_0010eabe;
    }
  }
  local_78._target = (xpath_allocator *)(*(long *)((long)pxVar4 - (pxVar4->header >> 8)) + -0x40);
LAB_0010eabe:
  local_78._state._root = (xpath_memory_block *)0x0;
  xpath_node_set_raw::push_back_grow(__return_storage_ptr__,(xpath_node *)&local_78,stack->result);
  return extraout_RAX_00;
}

Assistant:

xpath_node_set_raw eval_node_set(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval)
		{
			switch (_type)
			{
			case ast_op_union:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ls = _left->eval_node_set(c, stack, eval);
				xpath_node_set_raw rs = _right->eval_node_set(c, swapped_stack, eval);

				// we can optimize merging two sorted sets, but this is a very rare operation, so don't bother
				ls.set_type(xpath_node_set::type_unsorted);

				ls.append(rs.begin(), rs.end(), stack.result);
				ls.remove_duplicates(stack.temp);

				return ls;
			}

			case ast_filter:
			{
				xpath_node_set_raw set = _left->eval_node_set(c, stack, _test == predicate_constant_one ? nodeset_eval_first : nodeset_eval_all);

				// either expression is a number or it contains position() call; sort by document order
				if (_test != predicate_posinv) set.sort_do();

				bool once = eval_once(set.type(), eval);

				apply_predicate(set, 0, stack, once);

				return set;
			}

			case ast_func_id:
				return xpath_node_set_raw();

			case ast_step:
			{
				switch (_axis)
				{
				case axis_ancestor:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor>());

				case axis_ancestor_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor_or_self>());

				case axis_attribute:
					return step_do(c, stack, eval, axis_to_type<axis_attribute>());

				case axis_child:
					return step_do(c, stack, eval, axis_to_type<axis_child>());

				case axis_descendant:
					return step_do(c, stack, eval, axis_to_type<axis_descendant>());

				case axis_descendant_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_descendant_or_self>());

				case axis_following:
					return step_do(c, stack, eval, axis_to_type<axis_following>());

				case axis_following_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_following_sibling>());

				case axis_namespace:
					// namespaced axis is not supported
					return xpath_node_set_raw();

				case axis_parent:
					return step_do(c, stack, eval, axis_to_type<axis_parent>());

				case axis_preceding:
					return step_do(c, stack, eval, axis_to_type<axis_preceding>());

				case axis_preceding_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_preceding_sibling>());

				case axis_self:
					return step_do(c, stack, eval, axis_to_type<axis_self>());

				default:
					assert(false && "Unknown axis"); // unreachable
					return xpath_node_set_raw();
				}
			}

			case ast_step_root:
			{
				assert(!_right); // root step can't have any predicates

				xpath_node_set_raw ns;

				ns.set_type(xpath_node_set::type_sorted);

				if (c.n.node()) ns.push_back(c.n.node().root(), stack.result);
				else if (c.n.attribute()) ns.push_back(c.n.parent().root(), stack.result);

				return ns;
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_node_set)
				{
					const xpath_node_set& s = _data.variable->get_node_set();

					xpath_node_set_raw ns;

					ns.set_type(s.type());
					ns.append(s.begin(), s.end(), stack.result);

					return ns;
				}
			}

			// fallthrough
			default:
				assert(false && "Wrong expression for return type node set"); // unreachable
				return xpath_node_set_raw();
			}
		}